

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
wasm::Builder::makeElementSegment(Name name,Name table,Expression *offset,Type type)

{
  pointer pEVar1;
  __uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true> this;
  uintptr_t in_stack_00000008;
  Expression *offset_local;
  Type type_local;
  Name table_local;
  Name name_local;
  __single_object *seg;
  
  table_local.super_IString.str._M_str = name.super_IString.str._M_str;
  this.super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
  super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl = name.super_IString.str._M_len;
  type_local.id = table.super_IString.str._M_str;
  table_local.super_IString.str._M_len = (size_t)offset;
  std::make_unique<wasm::ElementSegment>();
  pEVar1 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
           operator->((unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                       *)this.
                         super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                         .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl);
  wasm::Name::operator=((Name *)pEVar1,(Name *)&table_local.super_IString.str._M_str);
  pEVar1 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
           operator->((unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                       *)this.
                         super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                         .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl);
  wasm::Name::operator=(&pEVar1->table,(Name *)&type_local);
  pEVar1 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
           operator->((unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                       *)this.
                         super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                         .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl);
  pEVar1->offset = (Expression *)type.id;
  pEVar1 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
           operator->((unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                       *)this.
                         super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                         .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl);
  (pEVar1->type).id = in_stack_00000008;
  return (__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
          )(tuple<wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>)
           this.
           super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
           _M_t.
           super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
           .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
}

Assistant:

static std::unique_ptr<ElementSegment>
  makeElementSegment(Name name,
                     Name table,
                     Expression* offset = nullptr,
                     Type type = Type(HeapType::func, Nullable)) {
    auto seg = std::make_unique<ElementSegment>();
    seg->name = name;
    seg->table = table;
    seg->offset = offset;
    seg->type = type;
    return seg;
  }